

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldExpandGroup
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  StructDataBitCount *pSVar1;
  Builder decl_00;
  bool bVar2;
  int iVar3;
  Builder *params_1;
  ArrayPtr<const_char> local_398;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  ChangeInfo local_360;
  ArrayPtr<const_char> local_340;
  Builder local_330;
  Builder local_300;
  Builder local_2d8;
  Builder local_2b0;
  String local_298;
  ArrayPtr<const_char> local_280;
  Builder local_270;
  Builder local_240;
  Builder local_218;
  Orphan<capnp::compiler::Expression> local_1f0;
  Builder local_1d0;
  Builder local_1a8;
  Orphan<capnp::compiler::Expression> local_180;
  undefined1 local_160 [8];
  Builder newField;
  Builder field;
  Orphan<capnp::compiler::LocatedInteger> local_e8;
  Builder local_c8;
  Orphan<capnp::compiler::LocatedText> local_90;
  Builder local_70;
  undefined1 local_48 [8];
  Builder newDecl;
  bool scopeHasUnion_local;
  uint *nextOrdinal_local;
  
  params_1 = (Builder *)nextOrdinal;
  newDecl._builder._39_1_ = scopeHasUnion;
  Declaration::Builder::initNestedDecls(&local_70,&decl,1);
  List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_48,&local_70,0);
  Declaration::Builder::disownName(&local_90,&decl);
  Declaration::Builder::adoptName((Builder *)local_48,&local_90);
  Orphan<capnp::compiler::LocatedText>::~Orphan(&local_90);
  Declaration::Builder::getId(&local_c8,(Builder *)local_48);
  pSVar1 = &field._builder.dataSize;
  Declaration::Builder::getId((Builder *)pSVar1,&decl);
  Declaration::Id::Builder::disownOrdinal(&local_e8,(Builder *)pSVar1);
  Declaration::Id::Builder::adoptOrdinal(&local_c8,&local_e8);
  Orphan<capnp::compiler::LocatedInteger>::~Orphan(&local_e8);
  pSVar1 = &newField._builder.dataSize;
  Declaration::Builder::getField((Builder *)pSVar1,&decl);
  Declaration::Builder::initField((Builder *)local_160,(Builder *)local_48);
  Declaration::Field::Builder::disownType(&local_180,(Builder *)pSVar1);
  Declaration::Field::Builder::adoptType((Builder *)local_160,&local_180);
  Orphan<capnp::compiler::Expression>::~Orphan(&local_180);
  Declaration::Field::Builder::getDefaultValue(&local_1a8,(Builder *)&newField._builder.dataSize);
  bVar2 = Declaration::Field::DefaultValue::Builder::isValue(&local_1a8);
  if (bVar2) {
    Declaration::Field::Builder::getDefaultValue(&local_1d0,(Builder *)local_160);
    Declaration::Field::Builder::getDefaultValue(&local_218,(Builder *)&newField._builder.dataSize);
    Declaration::Field::DefaultValue::Builder::disownValue(&local_1f0,&local_218);
    Declaration::Field::DefaultValue::Builder::adoptValue(&local_1d0,&local_1f0);
    Orphan<capnp::compiler::Expression>::~Orphan(&local_1f0);
  }
  else {
    Declaration::Field::Builder::getDefaultValue(&local_240,(Builder *)local_160);
    Declaration::Field::DefaultValue::Builder::setNone(&local_240);
  }
  Declaration::Builder::initName(&local_270,&decl);
  Declaration::Builder::getName(&local_2d8,(Builder *)local_48);
  LocatedText::Builder::getValue(&local_2b0,&local_2d8);
  kj::str<char_const(&)[2],capnp::Text::Builder>
            (&local_298,(kj *)0x2efd8f,(char (*) [2])&local_2b0,params_1);
  Text::Reader::Reader((Reader *)&local_280,&local_298);
  LocatedText::Builder::setValue(&local_270,(Reader)local_280);
  kj::String::~String(&local_298);
  Declaration::Builder::getId(&local_300,&decl);
  Declaration::Id::Builder::setUnspecified(&local_300);
  iVar3 = rand();
  if (iVar3 % 2 == 0) {
    Declaration::Builder::setGroup(&decl);
  }
  else {
    Declaration::Builder::setUnion(&decl);
    if ((newDecl._builder._39_1_ & 1) == 0) {
      iVar3 = rand();
      if (iVar3 % 2 == 0) {
        Declaration::Builder::getName(&local_330,&decl);
        Text::Reader::Reader((Reader *)&local_340,"");
        LocatedText::Builder::setValue(&local_330,(Reader)local_340);
      }
    }
    memcpy(&local_388,&decl,0x28);
    decl_00._builder.capTable = (CapTableBuilder *)uStack_380;
    decl_00._builder.segment = (SegmentBuilder *)local_388;
    decl_00._builder.data = (void *)local_378;
    decl_00._builder.pointers = (WirePointer *)uStack_370;
    decl_00._builder.dataSize = (undefined4)local_368;
    decl_00._builder.pointerCount = local_368._4_2_;
    decl_00._builder._38_2_ = local_368._6_2_;
    structAddField(&local_360,decl_00,nextOrdinal,(bool)(newDecl._builder._39_1_ & 1));
    ChangeInfo::~ChangeInfo(&local_360);
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_398,"Wrap a field in a singleton group.");
  ChangeInfo::ChangeInfo(__return_storage_ptr__,COMPATIBLE,(StringPtr)local_398);
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldExpandGroup(Declaration::Builder decl, uint& nextOrdinal,
                                   bool scopeHasUnion) {
  Declaration::Builder newDecl = decl.initNestedDecls(1)[0];
  newDecl.adoptName(decl.disownName());
  newDecl.getId().adoptOrdinal(decl.getId().disownOrdinal());

  auto field = decl.getField();
  auto newField = newDecl.initField();

  newField.adoptType(field.disownType());
  if (field.getDefaultValue().isValue()) {
    newField.getDefaultValue().adoptValue(field.getDefaultValue().disownValue());
  } else {
    newField.getDefaultValue().setNone();
  }

  decl.initName().setValue(kj::str("g", newDecl.getName().getValue()));
  decl.getId().setUnspecified();

  if (rand() % 2 == 0) {
    decl.setGroup();
  } else {
    decl.setUnion();
    if (!scopeHasUnion && rand() % 2 == 0) {
      // Make it an unnamed union.
      decl.getName().setValue("");
    }
    structAddField(decl, nextOrdinal, scopeHasUnion);  // union must have two members
  }

  return { COMPATIBLE, "Wrap a field in a singleton group." };
}